

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object_class_test.cpp
# Opt level: O0

int hello_world_class_impl_interface_static_set
              (klass cls,class_impl impl,accessor_type *accessor,value v)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  char *pcVar4;
  char *__src;
  undefined8 in_RCX;
  long in_RDX;
  undefined4 *in_RSI;
  char *key;
  AssertionResult gtest_ar;
  attribute attr;
  hello_world_class hello_world;
  void **in_stack_ffffffffffffff60;
  void **in_stack_ffffffffffffff68;
  AssertionResult *this;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  AssertHelper local_78;
  Message local_70 [4];
  undefined8 local_50;
  AssertionResult local_48;
  undefined8 local_38;
  undefined4 *local_30;
  undefined8 local_28;
  int local_4;
  
  local_38 = *(undefined8 *)(in_RDX + 8);
  local_50 = 0;
  this = &local_48;
  local_30 = in_RSI;
  local_28 = in_RCX;
  testing::internal::CmpHelperNE<void*,void*>
            ((char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),&this->success_,
             in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x10c447);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
               ,0xf7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_78,local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message((Message *)0x10c495);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c4d5);
  pcVar4 = (char *)attribute_name(local_38);
  if (pcVar4 == (char *)0x0) {
    local_4 = 1;
  }
  else {
    iVar2 = strcmp(pcVar4,"a");
    if (iVar2 == 0) {
      uVar3 = value_to_int(local_28);
      *local_30 = uVar3;
    }
    else {
      iVar2 = strcmp(pcVar4,"b");
      if (iVar2 == 0) {
        uVar3 = value_to_float(local_28);
        local_30[1] = uVar3;
      }
      else {
        iVar2 = strcmp(pcVar4,"c");
        if (iVar2 == 0) {
          pcVar4 = (char *)(local_30 + 2);
          __src = (char *)value_to_string(local_28);
          strncpy(pcVar4,__src,9);
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int hello_world_class_impl_interface_static_set(klass cls, class_impl impl, struct accessor_type *accessor, value v)
{
	hello_world_class hello_world = (hello_world_class)impl;
	attribute attr = accessor->data.attr;

	EXPECT_NE((void *)NULL, (void *)hello_world);

	(void)cls;

	char *key = attribute_name(attr);

	if (key == NULL)
	{
		return 1;
	}

	// Horrible but it is just a ilustrative example
	if (strcmp(key, "a") == 0)
	{
		hello_world->a = value_to_int(v);
	}
	else if (strcmp(key, "b") == 0)
	{
		hello_world->b = value_to_float(v);
	}
	else if (strcmp(key, "c") == 0)
	{
		strncpy(hello_world->c, value_to_string(v), 9);
	}

	return 0;
}